

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

Value __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::makeBuiltin
          (Interpreter *this,string *name,Params *params)

{
  anon_union_8_3_4e909c26_for_v aVar1;
  int *in_RDX;
  void **in_RSI;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *in_RDI;
  Value VVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  AST *body;
  Value r;
  AST **in_stack_ffffffffffffffc8;
  vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  *args_3;
  uint uVar3;
  undefined4 in_stack_fffffffffffffff4;
  
  args_3 = (vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
            *)0x0;
  uVar3 = 0x11;
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
         *)0x23c761);
  aVar1.h = &(anonymous_namespace)::Interpreter::
             makeHeap<jsonnet::internal::(anonymous_namespace)::HeapClosure,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>,decltype(nullptr),int,std::vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>>const&,jsonnet::internal::AST*&,std::__cxx11::string_const&>
                       ((Interpreter *)CONCAT44(in_stack_fffffffffffffff4,uVar3),in_RDI,in_RSI,
                        in_RDX,args_3,in_stack_ffffffffffffffc8,unaff_retaddr)->super_HeapEntity;
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::~map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
          *)0x23c7c4);
  VVar2._4_4_ = 0;
  VVar2.t = uVar3;
  VVar2.v.h = aVar1.h;
  return VVar2;
}

Assistant:

Value makeBuiltin(const std::string &name, const HeapClosure::Params &params)
    {
        AST *body = nullptr;
        Value r;
        r.t = Value::FUNCTION;
        r.v.h = makeHeap<HeapClosure>(BindingFrame(), nullptr, 0, params, body, name);
        return r;
    }